

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_setmetatable(lua_State *L,int idx)

{
  uint64_t uVar1;
  int iVar2;
  TValue *pTVar3;
  ulong uVar4;
  uint local_74;
  cTValue *o;
  GCtab *mt;
  global_State *g;
  int idx_local;
  lua_State *L_local;
  GCobj *o_2;
  TValue *o_1;
  
  pTVar3 = index2adr(L,idx);
  if (L->top[-1].u64 == 0xffffffffffffffff) {
    o = (cTValue *)0x0;
  }
  else {
    o = (cTValue *)(L->top[-1].u64 & 0x7fffffffffff);
  }
  uVar1 = (L->glref).ptr64;
  if ((int)(pTVar3->field_4).it >> 0xf == -0xc) {
    *(cTValue **)((pTVar3->u64 & 0x7fffffffffff) + 0x20) = o;
    if (((o != (cTValue *)0x0) && (((ulong)o[1] & 3) != 0)) &&
       ((*(byte *)((pTVar3->u64 & 0x7fffffffffff) + 8) & 4) != 0)) {
      uVar1 = (L->glref).ptr64;
      uVar4 = pTVar3->u64 & 0x7fffffffffff;
      *(byte *)(uVar4 + 8) = *(byte *)(uVar4 + 8) & 0xfb;
      *(undefined8 *)(uVar4 + 0x18) = *(undefined8 *)(uVar1 + 0x40);
      *(ulong *)(uVar1 + 0x40) = uVar4;
    }
  }
  else if ((int)(pTVar3->field_4).it >> 0xf == -0xd) {
    *(cTValue **)((pTVar3->u64 & 0x7fffffffffff) + 0x20) = o;
    if (((o != (cTValue *)0x0) && (((ulong)o[1] & 3) != 0)) &&
       ((*(byte *)((pTVar3->u64 & 0x7fffffffffff) + 8) & 4) != 0)) {
      lj_gc_barrierf((global_State *)(L->glref).ptr64,(GCobj *)(pTVar3->u64 & 0x7fffffffffff),
                     (GCobj *)o);
    }
  }
  else {
    iVar2 = lj_trace_flushall(L);
    if (iVar2 != 0) {
      lj_err_caller(L,LJ_ERR_NOGCMM);
    }
    if (((int)(pTVar3->field_4).it >> 0xf == -2) || ((int)(pTVar3->field_4).it >> 0xf == -3)) {
      *(cTValue **)(uVar1 + 0x268) = o;
      *(cTValue **)(uVar1 + 0x260) = o;
    }
    else {
      if ((uint)((int)(pTVar3->field_4).it >> 0xf) < 0xfffffff3) {
        local_74 = 0xd;
      }
      else {
        local_74 = (int)(pTVar3->field_4).it >> 0xf ^ 0xffffffff;
      }
      *(cTValue **)(uVar1 + 0x1a8 + (ulong)(local_74 + 0x16) * 8) = o;
    }
  }
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable(lua_State *L, int idx)
{
  global_State *g;
  GCtab *mt;
  cTValue *o = index2adr_check(L, idx);
  lj_checkapi_slot(1);
  if (tvisnil(L->top-1)) {
    mt = NULL;
  } else {
    lj_checkapi(tvistab(L->top-1), "top stack slot is not a table");
    mt = tabV(L->top-1);
  }
  g = G(L);
  if (tvistab(o)) {
    setgcref(tabV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarriert(L, tabV(o), mt);
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarrier(L, udataV(o), mt);
  } else {
    /* Flush cache, since traces specialize to basemt. But not during __gc. */
    if (lj_trace_flushall(L))
      lj_err_caller(L, LJ_ERR_NOGCMM);
    if (tvisbool(o)) {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_it(g, LJ_TTRUE), obj2gco(mt));
      setgcref(basemt_it(g, LJ_TFALSE), obj2gco(mt));
    } else {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_obj(g, o), obj2gco(mt));
    }
  }
  L->top--;
  return 1;
}